

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_1.c
# Opt level: O0

void amd_l1(longlong n,longlong *Ap,longlong *Ai,longlong *P,longlong *Pinv,longlong *Len,
           longlong slen,longlong *S,c_float *Control,c_float *Info)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R9;
  long in_stack_00000010;
  longlong *Tp;
  longlong *Sp;
  longlong *W;
  longlong *s;
  longlong *Degree;
  longlong *Elen;
  longlong *Head;
  longlong *Nv;
  longlong *Pe;
  longlong *Iw;
  longlong pj2;
  longlong p2;
  longlong p1;
  longlong pj;
  longlong iwlen;
  longlong pfree;
  longlong p;
  longlong k;
  longlong j;
  longlong i;
  longlong *in_stack_00000118;
  longlong in_stack_00000120;
  longlong *in_stack_00000130;
  longlong *in_stack_00000138;
  longlong *in_stack_00000140;
  longlong *in_stack_00000148;
  c_float *in_stack_00000170;
  long local_98;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  
  lVar6 = in_RDI * 8 + in_stack_00000010;
  lVar7 = in_RDI * 0x20 + lVar6;
  lVar8 = in_RDI * 8 + lVar7;
  local_88 = 0;
  for (local_70 = 0; local_70 < in_RDI; local_70 = local_70 + 1) {
    *(long *)(in_stack_00000010 + local_70 * 8) = local_88;
    *(long *)(lVar6 + local_70 * 8) = local_88;
    local_88 = *(long *)(in_R9 + local_70 * 8) + local_88;
  }
  local_78 = 0;
  do {
    if (in_RDI <= local_78) {
      for (local_70 = 0; local_70 < in_RDI; local_70 = local_70 + 1) {
        for (local_98 = *(long *)(lVar7 + local_70 * 8);
            local_98 < *(long *)(in_RSI + 8 + local_70 * 8); local_98 = local_98 + 1) {
          lVar1 = *(long *)(in_RDX + local_98 * 8);
          lVar2 = *(long *)(lVar6 + lVar1 * 8);
          *(long *)(lVar6 + lVar1 * 8) = lVar2 + 1;
          *(long *)(lVar8 + lVar2 * 8) = local_70;
          lVar2 = *(long *)(lVar6 + local_70 * 8);
          *(long *)(lVar6 + local_70 * 8) = lVar2 + 1;
          *(long *)(lVar8 + lVar2 * 8) = lVar1;
        }
      }
      amd_l2(in_stack_00000120,in_stack_00000118,(longlong *)n,Ap,(longlong)Ai,(longlong)P,
             in_stack_00000130,in_stack_00000138,in_stack_00000140,in_stack_00000148,
             (longlong *)slen,S,(longlong *)Control,Info,in_stack_00000170);
      return;
    }
    local_80 = *(long *)(in_RSI + local_78 * 8);
    lVar1 = *(long *)(in_RSI + 8 + local_78 * 8);
    while (local_80 < lVar1) {
      lVar2 = *(long *)(in_RDX + local_80 * 8);
      if (local_78 <= lVar2) {
        if (lVar2 == local_78) {
          local_80 = local_80 + 1;
        }
        break;
      }
      lVar3 = *(long *)(lVar6 + lVar2 * 8);
      *(long *)(lVar6 + lVar2 * 8) = lVar3 + 1;
      *(long *)(lVar8 + lVar3 * 8) = local_78;
      lVar3 = *(long *)(lVar6 + local_78 * 8);
      *(long *)(lVar6 + local_78 * 8) = lVar3 + 1;
      *(long *)(lVar8 + lVar3 * 8) = lVar2;
      local_80 = local_80 + 1;
      lVar3 = *(long *)(in_RSI + 8 + lVar2 * 8);
      for (local_98 = *(long *)(lVar7 + lVar2 * 8); local_98 < lVar3; local_98 = local_98 + 1) {
        lVar4 = *(long *)(in_RDX + local_98 * 8);
        if (local_78 <= lVar4) {
          if (lVar4 == local_78) {
            local_98 = local_98 + 1;
          }
          break;
        }
        lVar5 = *(long *)(lVar6 + lVar4 * 8);
        *(long *)(lVar6 + lVar4 * 8) = lVar5 + 1;
        *(long *)(lVar8 + lVar5 * 8) = lVar2;
        lVar5 = *(long *)(lVar6 + lVar2 * 8);
        *(long *)(lVar6 + lVar2 * 8) = lVar5 + 1;
        *(long *)(lVar8 + lVar5 * 8) = lVar4;
      }
      *(long *)(lVar7 + lVar2 * 8) = local_98;
    }
    *(long *)(lVar7 + local_78 * 8) = local_80;
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

GLOBAL void AMD_1
(
    Int n,		/* n > 0 */
    const Int Ap [ ],	/* input of size n+1, not modified */
    const Int Ai [ ],	/* input of size nz = Ap [n], not modified */
    Int P [ ],		/* size n output permutation */
    Int Pinv [ ],	/* size n output inverse permutation */
    Int Len [ ],	/* size n input, undefined on output */
    Int slen,		/* slen >= sum (Len [0..n-1]) + 7n,
			 * ideally slen = 1.2 * sum (Len) + 8n */
    Int S [ ],		/* size slen workspace */
    c_float Control [ ],	/* input array of size AMD_CONTROL */
    c_float Info [ ]	/* output array of size AMD_INFO */
)
{
    Int i, j, k, p, pfree, iwlen, pj, p1, p2, pj2, *Iw, *Pe, *Nv, *Head,
	*Elen, *Degree, *s, *W, *Sp, *Tp ;

    /* --------------------------------------------------------------------- */
    /* construct the matrix for AMD_2 */
    /* --------------------------------------------------------------------- */

    ASSERT (n > 0) ;

    iwlen = slen - 6*n ;
    s = S ;
    Pe = s ;	    s += n ;
    Nv = s ;	    s += n ;
    Head = s ;	    s += n ;
    Elen = s ;	    s += n ;
    Degree = s ;    s += n ;
    W = s ;	    s += n ;
    Iw = s ;	    s += iwlen ;

    ASSERT (AMD_valid (n, n, Ap, Ai) == AMD_OK) ;

    /* construct the pointers for A+A' */
    Sp = Nv ;			/* use Nv and W as workspace for Sp and Tp [ */
    Tp = W ;
    pfree = 0 ;
    for (j = 0 ; j < n ; j++)
    {
	Pe [j] = pfree ;
	Sp [j] = pfree ;
	pfree += Len [j] ;
    }

    /* Note that this restriction on iwlen is slightly more restrictive than
     * what is strictly required in AMD_2.  AMD_2 can operate with no elbow
     * room at all, but it will be very slow.  For better performance, at
     * least size-n elbow room is enforced. */
    ASSERT (iwlen >= pfree + n) ;

#ifndef NDEBUG
    for (p = 0 ; p < iwlen ; p++) Iw [p] = EMPTY ;
#endif

    for (k = 0 ; k < n ; k++)
    {
	AMD_DEBUG1 (("Construct row/column k= "ID" of A+A'\n", k))  ;
	p1 = Ap [k] ;
	p2 = Ap [k+1] ;

	/* construct A+A' */
	for (p = p1 ; p < p2 ; )
	{
	    /* scan the upper triangular part of A */
	    j = Ai [p] ;
	    ASSERT (j >= 0 && j < n) ;
	    if (j < k)
	    {
		/* entry A (j,k) in the strictly upper triangular part */
		ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		ASSERT (Sp [k] < (k == n-1 ? pfree : Pe [k+1])) ;
		Iw [Sp [j]++] = k ;
		Iw [Sp [k]++] = j ;
		p++ ;
	    }
	    else if (j == k)
	    {
		/* skip the diagonal */
		p++ ;
		break ;
	    }
	    else /* j > k */
	    {
		/* first entry below the diagonal */
		break ;
	    }
	    /* scan lower triangular part of A, in column j until reaching
	     * row k.  Start where last scan left off. */
	    ASSERT (Ap [j] <= Tp [j] && Tp [j] <= Ap [j+1]) ;
	    pj2 = Ap [j+1] ;
	    for (pj = Tp [j] ; pj < pj2 ; )
	    {
		i = Ai [pj] ;
		ASSERT (i >= 0 && i < n) ;
		if (i < k)
		{
		    /* A (i,j) is only in the lower part, not in upper */
		    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
		    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
		    Iw [Sp [i]++] = j ;
		    Iw [Sp [j]++] = i ;
		    pj++ ;
		}
		else if (i == k)
		{
		    /* entry A (k,j) in lower part and A (j,k) in upper */
		    pj++ ;
		    break ;
		}
		else /* i > k */
		{
		    /* consider this entry later, when k advances to i */
		    break ;
		}
	    }
	    Tp [j] = pj ;
	}
	Tp [k] = p ;
    }

    /* clean up, for remaining mismatched entries */
    for (j = 0 ; j < n ; j++)
    {
	for (pj = Tp [j] ; pj < Ap [j+1] ; pj++)
	{
	    i = Ai [pj] ;
	    ASSERT (i >= 0 && i < n) ;
	    /* A (i,j) is only in the lower part, not in upper */
	    ASSERT (Sp [i] < (i == n-1 ? pfree : Pe [i+1])) ;
	    ASSERT (Sp [j] < (j == n-1 ? pfree : Pe [j+1])) ;
	    Iw [Sp [i]++] = j ;
	    Iw [Sp [j]++] = i ;
	}
    }

#ifndef NDEBUG
    for (j = 0 ; j < n-1 ; j++) ASSERT (Sp [j] == Pe [j+1]) ;
    ASSERT (Sp [n-1] == pfree) ;
#endif

    /* Tp and Sp no longer needed ] */

    /* --------------------------------------------------------------------- */
    /* order the matrix */
    /* --------------------------------------------------------------------- */

    AMD_2 (n, Pe, Iw, Len, iwlen, pfree,
	Nv, Pinv, P, Head, Elen, Degree, W, Control, Info) ;
}